

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflateGetParams(zng_stream *strm,zng_deflate_param_value *params,size_t count)

{
  internal_state *piVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong in_RDX;
  long in_RSI;
  zng_stream *in_RDI;
  int32_t version_error;
  int32_t buf_error;
  size_t i;
  deflate_state *s;
  int32_t local_40;
  ulong local_30;
  int32_t local_4;
  
  bVar2 = false;
  bVar3 = false;
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    *(undefined4 *)(in_RSI + local_30 * 0x20 + 0x18) = 0;
  }
  iVar4 = deflateStateCheck(in_RDI);
  if (iVar4 == 0) {
    piVar1 = in_RDI->state;
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      iVar4 = *(int *)(in_RSI + local_30 * 0x20);
      if (iVar4 == 0) {
        if (*(ulong *)(in_RSI + local_30 * 0x20 + 0x10) < 4) {
          *(undefined4 *)(in_RSI + local_30 * 0x20 + 0x18) = 0xfffffffb;
        }
        else {
          **(int **)(in_RSI + local_30 * 0x20 + 8) = piVar1->level;
        }
      }
      else if (iVar4 == 1) {
        if (*(ulong *)(in_RSI + local_30 * 0x20 + 0x10) < 4) {
          *(undefined4 *)(in_RSI + local_30 * 0x20 + 0x18) = 0xfffffffb;
        }
        else {
          **(int **)(in_RSI + local_30 * 0x20 + 8) = piVar1->strategy;
        }
      }
      else if (iVar4 == 2) {
        if (*(ulong *)(in_RSI + local_30 * 0x20 + 0x10) < 4) {
          *(undefined4 *)(in_RSI + local_30 * 0x20 + 0x18) = 0xfffffffb;
        }
        else {
          **(int **)(in_RSI + local_30 * 0x20 + 8) = piVar1->reproducible;
        }
      }
      else {
        *(undefined4 *)(in_RSI + local_30 * 0x20 + 0x18) = 0xfffffffa;
        bVar3 = true;
      }
      if (*(int *)(in_RSI + local_30 * 0x20 + 0x18) == -5) {
        bVar2 = true;
      }
    }
    if (bVar2) {
      local_40 = -5;
    }
    else {
      local_40 = 0;
      if (bVar3) {
        local_40 = -6;
      }
    }
    local_4 = local_40;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT zng_deflateGetParams(zng_stream *strm, zng_deflate_param_value *params, size_t count) {
    deflate_state *s;
    size_t i;
    int32_t buf_error = 0;
    int32_t version_error = 0;

    /* Initialize the statuses. */
    for (i = 0; i < count; i++)
        params[i].status = Z_OK;

    /* Check whether the stream state is consistent. */
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

    for (i = 0; i < count; i++) {
        switch (params[i].param) {
            case Z_DEFLATE_LEVEL:
                if (params[i].size < sizeof(int))
                    params[i].status = Z_BUF_ERROR;
                else
                    *(int *)params[i].buf = s->level;
                break;
            case Z_DEFLATE_STRATEGY:
                if (params[i].size < sizeof(int))
                    params[i].status = Z_BUF_ERROR;
                else
                    *(int *)params[i].buf = s->strategy;
                break;
            case Z_DEFLATE_REPRODUCIBLE:
                if (params[i].size < sizeof(int))
                    params[i].status = Z_BUF_ERROR;
                else
                    *(int *)params[i].buf = s->reproducible;
                break;
            default:
                params[i].status = Z_VERSION_ERROR;
                version_error = 1;
                break;
        }
        if (params[i].status == Z_BUF_ERROR)
            buf_error = 1;
    }
    return buf_error ? Z_BUF_ERROR : (version_error ? Z_VERSION_ERROR : Z_OK);
}